

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cproxy.c
# Opt level: O3

void http_digest_response
               (BinarySink *bs,ptrlen username,ptrlen password,ptrlen realm,ptrlen method,ptrlen uri
               ,ptrlen qop,ptrlen nonce,ptrlen opaque,uint32_t nonce_count,HttpDigestHash hash,
               _Bool hash_username)

{
  BinarySink *bs_00;
  char *__s;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ssh_hash *psVar1;
  long *plVar2;
  size_t sVar3;
  size_t len;
  size_t sVar4;
  uchar *data;
  void *pvVar5;
  long lVar6;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pl_04;
  ptrlen pl_05;
  ptrlen pl_06;
  ptrlen pl_07;
  ptrlen pl_08;
  ptrlen pl_09;
  ptrlen pl_10;
  ptrlen pl_11;
  ptrlen pl_12;
  ptrlen pl_13;
  ptrlen pl_14;
  ptrlen pl_15;
  ptrlen pl_16;
  ptrlen pl_17;
  ptrlen pl_18;
  ptrlen pl_19;
  ptrlen pl_20;
  uchar client_nonce_raw [33];
  uchar rsphash [114];
  uchar a1hash [114];
  uchar a2hash [114];
  uint local_26c;
  void *local_268;
  size_t local_260;
  size_t local_258;
  void *local_250;
  ssh_hashalg *local_248;
  size_t local_240;
  size_t local_238;
  void *local_230;
  size_t local_228;
  void *local_220;
  size_t local_218;
  void *local_210;
  char local_208 [48];
  uchar local_1d8 [48];
  uchar local_1a8 [128];
  uchar local_128 [128];
  undefined1 local_a8 [120];
  
  local_260 = username.len;
  local_268 = username.ptr;
  local_248 = httphashalgs[hash];
  local_26c = nonce_count >> 0x18 | (nonce_count & 0xff0000) >> 8 | (nonce_count & 0xff00) << 8 |
              nonce_count << 0x18;
  local_240 = httphashlengths[hash];
  data = local_1d8;
  random_read(data,0x21);
  lVar6 = 0;
  do {
    base64_encode_atom(data,3,local_208 + lVar6);
    data = data + 3;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x2c);
  psVar1 = (*local_248->new)(local_248);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  pl.len = local_260;
  pl.ptr = local_268;
  BinarySink_put_datapl(psVar1->binarysink_,pl);
  BinarySink_put_byte(psVar1->binarysink_,':');
  local_250 = realm.ptr;
  local_258 = realm.len;
  BinarySink_put_datapl(psVar1->binarysink_,realm);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_datapl(psVar1->binarysink_,password);
  plVar2 = (long *)(*psVar1->vt->new)();
  (**(code **)(*plVar2 + 0x10))(plVar2,psVar1);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_128);
  (**(code **)(*plVar2 + 0x20))(plVar2);
  (*psVar1->vt->reset)(psVar1);
  BinarySink_put_datapl(psVar1->binarysink_,method);
  BinarySink_put_byte(psVar1->binarysink_,':');
  local_210 = uri.ptr;
  local_218 = uri.len;
  BinarySink_put_datapl(psVar1->binarysink_,uri);
  plVar2 = (long *)(*psVar1->vt->new)();
  (**(code **)(*plVar2 + 0x10))(plVar2,psVar1);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_a8);
  (**(code **)(*plVar2 + 0x20))(plVar2);
  (*psVar1->vt->reset)(psVar1);
  len = local_240;
  BinarySink_put_hex_data(psVar1->binarysink_,local_128,local_240);
  BinarySink_put_byte(psVar1->binarysink_,':');
  local_230 = nonce.ptr;
  local_238 = nonce.len;
  BinarySink_put_datapl(psVar1->binarysink_,nonce);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_hex_data(psVar1->binarysink_,&local_26c,4);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_data(psVar1->binarysink_,local_208,0x2c);
  BinarySink_put_byte(psVar1->binarysink_,':');
  local_220 = qop.ptr;
  local_228 = qop.len;
  BinarySink_put_datapl(psVar1->binarysink_,qop);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_hex_data(psVar1->binarysink_,local_a8,len);
  (*psVar1->vt->digest)(psVar1,local_1a8);
  (*psVar1->vt->free)(psVar1);
  pl_02.len = 10;
  pl_02.ptr = "username=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_02);
  if (hash_username) {
    psVar1 = (*local_248->new)(local_248);
    if (psVar1 != (ssh_hash *)0x0) {
      (*psVar1->vt->reset)(psVar1);
    }
    pl_00.len = local_260;
    pl_00.ptr = local_268;
    BinarySink_put_datapl(psVar1->binarysink_,pl_00);
    BinarySink_put_byte(psVar1->binarysink_,':');
    pvVar5 = local_250;
    sVar4 = local_258;
    pl_03.len = local_258;
    pl_03.ptr = local_250;
    BinarySink_put_datapl(psVar1->binarysink_,pl_03);
    (*psVar1->vt->digest)(psVar1,local_128);
    (*psVar1->vt->free)(psVar1);
    len = local_240;
    BinarySink_put_hex_data(bs->binarysink_,local_128,local_240);
  }
  else {
    pl_01.len = local_260;
    pl_01.ptr = local_268;
    BinarySink_put_datapl(bs->binarysink_,pl_01);
    sVar4 = local_258;
    pvVar5 = local_250;
  }
  pl_04.len = 10;
  pl_04.ptr = "\", realm=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_04);
  pl_05.len = sVar4;
  pl_05.ptr = pvVar5;
  BinarySink_put_datapl(bs->binarysink_,pl_05);
  pl_06.len = 8;
  pl_06.ptr = "\", uri=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_06);
  pl_07.len = local_218;
  pl_07.ptr = local_210;
  BinarySink_put_datapl(bs->binarysink_,pl_07);
  pl_08.len = 0xd;
  pl_08.ptr = "\", algorithm=";
  BinarySink_put_datapl(bs->binarysink_,pl_08);
  bs_00 = bs->binarysink_;
  __s = httphashnames[hash];
  sVar3 = strlen(__s);
  pl_09.len = sVar3;
  pl_09.ptr = __s;
  BinarySink_put_datapl(bs_00,pl_09);
  pl_10.len = 9;
  pl_10.ptr = ", nonce=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_10);
  pl_11.len = local_238;
  pl_11.ptr = local_230;
  BinarySink_put_datapl(bs->binarysink_,pl_11);
  pl_12.len = 6;
  pl_12.ptr = "\", nc=";
  BinarySink_put_datapl(bs->binarysink_,pl_12);
  BinarySink_put_hex_data(bs->binarysink_,&local_26c,4);
  pl_13.len = 10;
  pl_13.ptr = ", cnonce=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_13);
  BinarySink_put_data(bs->binarysink_,local_208,0x2c);
  pl_14.len = 7;
  pl_14.ptr = "\", qop=";
  BinarySink_put_datapl(bs->binarysink_,pl_14);
  pl_15.len = local_228;
  pl_15.ptr = local_220;
  BinarySink_put_datapl(bs->binarysink_,pl_15);
  pl_16.len = 0xc;
  pl_16.ptr = ", response=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_16);
  BinarySink_put_hex_data(bs->binarysink_,local_1a8,len);
  pl_17.len = 1;
  pl_17.ptr = "\"";
  BinarySink_put_datapl(bs->binarysink_,pl_17);
  if (opaque.ptr != (void *)0x0) {
    pl_18.len = 10;
    pl_18.ptr = ", opaque=\"";
    BinarySink_put_datapl(bs->binarysink_,pl_18);
    BinarySink_put_datapl(bs->binarysink_,opaque);
    pl_19.len = 1;
    pl_19.ptr = "\"";
    BinarySink_put_datapl(bs->binarysink_,pl_19);
  }
  if (hash_username) {
    pl_20.len = 0xf;
    pl_20.ptr = ", userhash=true";
    BinarySink_put_datapl(bs->binarysink_,pl_20);
  }
  smemclr(local_128,0x72);
  smemclr(local_a8,0x72);
  smemclr(local_1a8,0x72);
  smemclr(local_1d8,0x21);
  smemclr(local_208,0x2c);
  return;
}

Assistant:

void http_digest_response(BinarySink *bs, ptrlen username, ptrlen password,
                          ptrlen realm, ptrlen method, ptrlen uri, ptrlen qop,
                          ptrlen nonce, ptrlen opaque, uint32_t nonce_count,
                          HttpDigestHash hash, bool hash_username)
{
    unsigned char a1hash[MAX_HASH_LEN];
    unsigned char a2hash[MAX_HASH_LEN];
    unsigned char rsphash[MAX_HASH_LEN];
    const ssh_hashalg *alg = httphashalgs[hash];
    size_t hashlen = httphashlengths[hash];

    unsigned char ncbuf[4];
    PUT_32BIT_MSB_FIRST(ncbuf, nonce_count);

    unsigned char client_nonce_raw[33];
    random_read(client_nonce_raw, lenof(client_nonce_raw));
    char client_nonce_base64[lenof(client_nonce_raw) / 3 * 4];
    for (unsigned i = 0; i < lenof(client_nonce_raw)/3; i++)
        base64_encode_atom(client_nonce_raw + 3*i, 3,
                           client_nonce_base64 + 4*i);

    /*
     * RFC 7616 section 3.4.2: the hash "A1" is a hash of
     * username:realm:password (in the absence of hash names like
     * "MD5-sess" which as far as I know don't sensibly apply to
     * proxies and HTTP CONNECT).
     */
    ssh_hash *h = ssh_hash_new(alg);
    put_datapl(h, username);
    put_byte(h, ':');
    put_datapl(h, realm);
    put_byte(h, ':');
    put_datapl(h, password);
    ssh_hash_digest_nondestructive(h, a1hash);

    /*
     * RFC 7616 section 3.4.3: the hash "A2" is a hash of method:uri
     * (in the absence of more interesting quality-of-protection
     * schemes than plain "auth" - e.g. "auth-int" hashes the entire
     * document as well - which again I don't think make sense in the
     * context of proxies and CONNECT).
     */
    ssh_hash_reset(h);
    put_datapl(h, method);
    put_byte(h, ':');
    put_datapl(h, uri);
    ssh_hash_digest_nondestructive(h, a2hash);

    /*
     * RFC 7616 section 3.4.1: the overall output hash in the
     * "response" parameter of the authorization header is a hash of
     * A1:nonce:nonce-count:client-nonce:qop:A2, where A1 and A2 are
     * the hashes computed above.
     */
    ssh_hash_reset(h);
    put_hex_data(h, a1hash, hashlen);
    put_byte(h, ':');
    put_datapl(h, nonce);
    put_byte(h, ':');
    put_hex_data(h, ncbuf, 4);
    put_byte(h, ':');
    put_data(h, client_nonce_base64, lenof(client_nonce_base64));
    put_byte(h, ':');
    put_datapl(h, qop);
    put_byte(h, ':');
    put_hex_data(h, a2hash, hashlen);
    ssh_hash_final(h, rsphash);

    /*
     * Now construct the output header (everything after the initial
     * "Proxy-Authorization: Digest ") and write it to the provided
     * BinarySink.
     */
    put_datalit(bs, "username=\"");
    if (hash_username) {
        /*
         * RFC 7616 section 3.4.4: if we're hashing the username, we
         * actually hash username:realm (like a truncated version of
         * A1 above).
         */
        ssh_hash *h = ssh_hash_new(alg);
        put_datapl(h, username);
        put_byte(h, ':');
        put_datapl(h, realm);
        ssh_hash_final(h, a1hash);
        put_hex_data(bs, a1hash, hashlen);
    } else {
        put_datapl(bs, username);
    }
    put_datalit(bs, "\", realm=\"");
    put_datapl(bs, realm);
    put_datalit(bs, "\", uri=\"");
    put_datapl(bs, uri);
    put_datalit(bs, "\", algorithm=");
    put_dataz(bs, httphashnames[hash]);
    put_datalit(bs, ", nonce=\"");
    put_datapl(bs, nonce);
    put_datalit(bs, "\", nc=");
    put_hex_data(bs, ncbuf, 4);
    put_datalit(bs, ", cnonce=\"");
    put_data(bs, client_nonce_base64, lenof(client_nonce_base64));
    put_datalit(bs, "\", qop=");
    put_datapl(bs, qop);
    put_datalit(bs, ", response=\"");
    put_hex_data(bs, rsphash, hashlen);
    put_datalit(bs, "\"");

    if (opaque.ptr) {
        put_datalit(bs, ", opaque=\"");
        put_datapl(bs, opaque);
        put_datalit(bs, "\"");
    }

    if (hash_username) {
        put_datalit(bs, ", userhash=true");
    }

    smemclr(a1hash, lenof(a1hash));
    smemclr(a2hash, lenof(a2hash));
    smemclr(rsphash, lenof(rsphash));
    smemclr(client_nonce_raw, lenof(client_nonce_raw));
    smemclr(client_nonce_base64, lenof(client_nonce_base64));
}